

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O0

bool __thiscall ON_Sphere::Transform(ON_Sphere *this,ON_Xform *xform)

{
  bool bVar1;
  undefined1 local_a0 [7];
  bool rc;
  ON_Circle xc;
  ON_Xform *xform_local;
  ON_Sphere *this_local;
  
  xc.radius = (double)xform;
  ON_Circle::ON_Circle((ON_Circle *)local_a0,&this->plane,this->radius);
  bVar1 = ON_Circle::Transform((ON_Circle *)local_a0,(ON_Xform *)xc.radius);
  if (bVar1) {
    memcpy(this,local_a0,0x80);
    this->radius = xc.plane.plane_equation.d;
  }
  ON_Circle::~ON_Circle((ON_Circle *)local_a0);
  return bVar1;
}

Assistant:

bool ON_Sphere::Transform( const ON_Xform& xform )
{
  ON_Circle xc(plane,radius);
  bool rc = xc.Transform(xform);
  if (rc)
  {
    plane = xc.plane;
    radius = xc.radius;
  }
  return rc;
}